

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.cpp
# Opt level: O1

int __thiscall dic::dictAdd(dic *this,int dictidx,void *key,void *obj)

{
  dictEntry **ppdVar1;
  ulong uVar2;
  char *__s2;
  uint uVar3;
  int iVar4;
  void *pvVar5;
  pointer pdVar6;
  int extraout_EDX;
  long lVar7;
  long *plVar8;
  ulong uVar9;
  
  pdVar6 = (this->dc).super__Vector_base<dict,_std::allocator<dict>_>._M_impl.
           super__Vector_impl_data._M_start;
  (pdVar6[dictidx].type)->hashFunction = murmurhash2;
  pvVar5 = dict_find(this,dictidx,0,key);
  uVar3 = 0xffffffff;
  if (pvVar5 == (void *)0x0) {
    uVar3 = murmurhash2(key);
    uVar3 = uVar3 & (uint)pdVar6[dictidx].ht[0].sizemask;
    ppdVar1 = pdVar6[dictidx].ht[0].table;
    lVar7 = (long)(int)uVar3;
    ppdVar1[lVar7]->key = key;
    (ppdVar1[lVar7]->v).val = obj;
    pdVar6 = (this->dc).super__Vector_base<dict,_std::allocator<dict>_>._M_impl.
             super__Vector_impl_data._M_start;
    *(undefined8 *)(*(long *)((long)pdVar6[dictidx].ht[0].table + lVar7 * 8) + 0x10) = 0;
    uVar2 = pdVar6[dictidx].ht[0].size;
    uVar9 = pdVar6[dictidx].ht[0].used + 1;
    pdVar6[dictidx].ht[0].used = uVar9;
    if (uVar2 <= uVar9) {
      rehash(this,dictidx);
      lVar7 = *(long *)((this->dc).super__Vector_base<dict,_std::allocator<dict>_>._M_impl.
                        super__Vector_impl_data._M_start[dictidx].ht + extraout_EDX);
      uVar3 = murmurhash2(pdVar6);
      plVar8 = *(long **)(lVar7 + (ulong)uVar3 * 8);
      if (plVar8 != (long *)0x0) {
        __s2 = (char *)pdVar6->privdata;
        do {
          iVar4 = strcmp(*(char **)(*plVar8 + 8),__s2);
          if (iVar4 == 0) goto LAB_00106c50;
          plVar8 = (long *)plVar8[2];
        } while (plVar8 != (long *)0x0);
      }
      plVar8 = (long *)0x0;
LAB_00106c50:
      return (int)plVar8;
    }
  }
  return uVar3;
}

Assistant:

int dic::dictAdd(int dictidx,void *key,void *obj){
    dc[dictidx].type->hashFunction=dic::murmurhash2;
    int hash=dc[dictidx].type->hashFunction(key);
    int index=hash&dc[dictidx].ht[0].sizemask;
    if(dic::dict_find(dictidx,0,key)==NULL){
        if(dc[dictidx].ht[0].table[index]==NULL){
            dc[dictidx].ht[0].table[index]->key=key;
            dc[dictidx].ht[0].table[index]->v.val=obj;
            dc[dictidx].ht[0].table[index]->next=NULL;
        }else{
            dictEntry *tmp=dc[dictidx].ht[0].table[index];  
            while(tmp!=NULL)
                tmp=tmp->next;
            dictEntry *newEntry=NULL;
            newEntry->key=key;
            newEntry->v.val=obj;
            newEntry->next=NULL;
            tmp->next=newEntry;
        }
        dc[dictidx].ht[0].used++;
        if(dc[dictidx].ht[0].used/dc[dictidx].ht[0].size>=1)
            dic::rehash(dictidx);
        //if rehash

        return index;}  
    else return -1;//already in 
}